

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_util.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* anon_unknown.dwarf_15e08f::split(string *str,size_t pos)

{
  long in_RDX;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_type size;
  size_type end;
  size_type start;
  char *anySpace;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret;
  long local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff90;
  string local_60 [32];
  long local_40;
  long local_38;
  long local_30;
  undefined1 local_21;
  char *local_20;
  long local_18;
  char *local_10;
  
  local_20 = " \t\r\n\v\f";
  local_21 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x2b682c);
  while ((local_18 != -1 &&
         (local_30 = std::__cxx11::string::find_first_not_of(local_10,0x307226), local_30 != -1))) {
    local_38 = std::__cxx11::string::find_first_of(local_10,0x307226);
    if (local_38 == -1) {
      local_88 = -1;
    }
    else {
      local_88 = local_38 - local_30;
    }
    local_40 = local_88;
    std::__cxx11::string::substr((ulong)local_60,(ulong)local_10);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(in_stack_ffffffffffffff90,in_RDI);
    std::__cxx11::string::~string(local_60);
    local_18 = local_38;
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::string> split(std::string const& str, size_t pos = 0)
	{
		const char* const anySpace = " \t\r\n\v\f";
		
		std::vector<std::string> ret;
		while (pos != std::string::npos) {
			auto start = str.find_first_not_of(anySpace, pos);
			if (start == std::string::npos) break;
			
			auto end = str.find_first_of(anySpace, start);
			auto size = end==std::string::npos ? end : end-start;
			ret.emplace_back(str.substr(start, size));
			
			pos = end;
		}
		
		return ret;
	}